

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

void __thiscall
Jinx::Impl::Runtime::RegisterFunction
          (Runtime *this,FunctionSignature *signature,BufferPtr *bytecode,size_t offset)

{
  int iVar1;
  shared_ptr<Jinx::Impl::FunctionDefinition> functionDefPtr;
  FunctionDefinition *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  pair<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_> local_40;
  size_t local_28;
  
  local_28 = offset;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_functionMutex);
  if (iVar1 == 0) {
    local_50 = (FunctionDefinition *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Jinx::Impl::FunctionDefinition,Jinx::Allocator<Jinx::Impl::FunctionDefinition>,Jinx::Impl::FunctionSignature_const&,std::shared_ptr<Jinx::Buffer>const&,unsigned_long&>
              (&local_48,&local_50,(Allocator<Jinx::Impl::FunctionDefinition> *)&local_40,signature,
               bytecode,&local_28);
    local_40.first = signature->m_id;
    local_40.second.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_50;
    local_40.second.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_48._M_pi;
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      }
    }
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>,std::less<unsigned_long>,Jinx::StaticAllocator<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,4096ul,16ul>>
    ::_M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>,std::less<unsigned_long>,Jinx::StaticAllocator<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,4096ul,16ul>>
                *)&this->m_functionMap,&local_40);
    if (local_40.second.
        super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.second.
                 super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_pi);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_functionMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

inline void Runtime::RegisterFunction(const FunctionSignature & signature, const BufferPtr & bytecode, size_t offset)
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto functionDefPtr = std::allocate_shared<FunctionDefinition>(Allocator<FunctionDefinition>(), signature, bytecode, offset);
		m_functionMap.insert(std::make_pair(signature.GetId(), functionDefPtr));
	}